

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O2

void __thiscall Resolver::resolve(Resolver *this,String *host,uint16_t port,SharedPtr *socket)

{
  addrinfo *paVar1;
  int iVar2;
  int iVar3;
  sockaddr *psVar4;
  Resolver *pRVar5;
  long lVar6;
  SharedPtr *pSVar7;
  size_t sVar8;
  in_addr inaddr4;
  in6_addr inaddr6;
  anon_struct_16_2_74ab348b addrs [2];
  
  addrs[0].af = 2;
  addrs[0].dst = &inaddr4;
  addrs[1].af = 10;
  addrs[1].dst = &inaddr6;
  lVar6 = 8;
  do {
    if (lVar6 + 0x10 == 0x38) {
      addrs[0].af = 0;
      addrs[0]._4_4_ = 0;
      addrs[1].af = 0;
      addrs[1]._4_4_ = 0;
      addrs[1].dst = (void *)0x0;
      addrs[0].dst = (void *)0x1;
      iVar3 = getaddrinfo((host->mString)._M_dataplus._M_p,(char *)0x0,(addrinfo *)addrs,
                          (addrinfo **)this);
      pRVar5 = this;
      if (iVar3 != 0) {
        inaddr6.__in6_u.__u6_addr32[0] = 1;
        pSVar7 = socket;
        Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
        operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                    *)&((socket->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->mSignalError,socket,(Error *)&inaddr6);
        SocketClient::close((socket->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr,(int)pSVar7);
        return;
      }
      while( true ) {
        paVar1 = pRVar5->res;
        if (paVar1 == (addrinfo *)0x0) {
          if (this->addr != (sockaddr *)0x0) {
            return;
          }
          inaddr6.__in6_u.__u6_addr32[0] = 1;
          pSVar7 = socket;
          Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
          operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                      *)&((socket->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->mSignalError,socket,(Error *)&inaddr6);
          SocketClient::close((socket->super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>)
                              ._M_ptr,(int)pSVar7);
          freeaddrinfo((addrinfo *)this->res);
          this->res = (addrinfo *)0x0;
          return;
        }
        if (paVar1->ai_family == 10) break;
        if (paVar1->ai_family == 2) {
          psVar4 = paVar1->ai_addr;
          this->addr = psVar4;
          *(uint16_t *)psVar4->sa_data = port << 8 | port >> 8;
          this->size = 0x10;
          return;
        }
        pRVar5 = (Resolver *)&paVar1->ai_next;
      }
      psVar4 = paVar1->ai_addr;
      this->addr = psVar4;
      *(uint16_t *)psVar4->sa_data = port << 8 | port >> 8;
      this->size = 0x1c;
      return;
    }
    iVar3 = *(int *)((long)addrs + lVar6 + -8);
    iVar2 = inet_pton(iVar3,(host->mString)._M_dataplus._M_p,*(void **)((long)&addrs[0].af + lVar6))
    ;
    lVar6 = lVar6 + 0x10;
  } while (iVar2 != 1);
  if (iVar3 == 10) {
    sVar8 = 0x1c;
    psVar4 = (sockaddr *)operator_new(0x1c);
    psVar4[1].sa_data[2] = '\0';
    psVar4[1].sa_data[3] = '\0';
    psVar4[1].sa_data[4] = '\0';
    psVar4[1].sa_data[5] = '\0';
    psVar4[1].sa_data[6] = '\0';
    psVar4[1].sa_data[7] = '\0';
    psVar4[1].sa_data[8] = '\0';
    psVar4[1].sa_data[9] = '\0';
    psVar4->sa_data[2] = '\0';
    psVar4->sa_data[3] = '\0';
    psVar4->sa_data[4] = '\0';
    psVar4->sa_data[5] = '\0';
    psVar4->sa_data[6] = '\0';
    psVar4->sa_data[7] = '\0';
    psVar4->sa_data[8] = '\0';
    psVar4->sa_data[9] = '\0';
    *(undefined8 *)(psVar4->sa_data + 10) = 0;
    *(ulong *)(psVar4->sa_data + 6) =
         CONCAT44(inaddr6.__in6_u.__u6_addr32[1],inaddr6.__in6_u.__u6_addr32[0]);
    psVar4[1].sa_family = inaddr6.__in6_u._8_2_;
    psVar4[1].sa_data[0] = inaddr6.__in6_u._10_1_;
    psVar4[1].sa_data[1] = inaddr6.__in6_u._11_1_;
    psVar4[1].sa_data[2] = inaddr6.__in6_u._12_1_;
    psVar4[1].sa_data[3] = inaddr6.__in6_u._13_1_;
    psVar4[1].sa_data[4] = inaddr6.__in6_u._14_1_;
    psVar4[1].sa_data[5] = inaddr6.__in6_u._15_1_;
    psVar4->sa_family = 10;
  }
  else {
    if (iVar3 != 2) {
      __assert_fail("addrs[i].af == AF_INET6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                    ,0x8a,
                    "void Resolver::resolve(const String &, uint16_t, const SocketClient::SharedPtr &)"
                   );
    }
    sVar8 = 0x10;
    psVar4 = (sockaddr *)operator_new(0x10);
    psVar4->sa_data[6] = '\0';
    psVar4->sa_data[7] = '\0';
    psVar4->sa_data[8] = '\0';
    psVar4->sa_data[9] = '\0';
    psVar4->sa_data[10] = '\0';
    psVar4->sa_data[0xb] = '\0';
    psVar4->sa_data[0xc] = '\0';
    psVar4->sa_data[0xd] = '\0';
    *(in_addr_t *)(psVar4->sa_data + 2) = inaddr4.s_addr;
    psVar4->sa_family = 2;
  }
  *(uint16_t *)psVar4->sa_data = port << 8 | port >> 8;
  this->addr = psVar4;
  this->size = sVar8;
  return;
}

Assistant:

void Resolver::resolve(const String& host, uint16_t port, const SocketClient::SharedPtr& socket)
{
    // first, see if this parses as an IP mAddress
    {
        struct in_addr inaddr4;
        struct in6_addr inaddr6;
        struct { int af; void* dst; } addrs[2] = {
            { AF_INET, &inaddr4 },
            { AF_INET6, &inaddr6 }
        };
        for (int i = 0; i < 2; ++i) {
            if (inet_pton(addrs[i].af, host.constData(), addrs[i].dst) == 1) {
                // yes, use that
                if (addrs[i].af == AF_INET) {
                    sockaddr_in* newaddr = new sockaddr_in;
                    memset(newaddr, '\0', sizeof(sockaddr_in));
                    memcpy(&newaddr->sin_addr, &inaddr4, sizeof(struct in_addr));
                    newaddr->sin_family = AF_INET;
                    newaddr->sin_port = htons(port);
                    addr = reinterpret_cast<sockaddr*>(newaddr);
                    size = sizeof(sockaddr_in);
                } else {
                    assert(addrs[i].af == AF_INET6);
                    sockaddr_in6* newaddr = new sockaddr_in6;
                    memset(newaddr, '\0', sizeof(sockaddr_in6));
                    memcpy(&newaddr->sin6_addr, &inaddr6, sizeof(struct in6_addr));
                    newaddr->sin6_family = AF_INET6;
                    newaddr->sin6_port = htons(port);
                    addr = reinterpret_cast<sockaddr*>(newaddr);
                    size = sizeof(sockaddr_in6);
                }
                return;
            }
        }
    }

    // not an ip mAddress, try to resolve it
    addrinfo hints, *p;

    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC; // AF_INET or AF_INET6 to force version
    hints.ai_socktype = SOCK_STREAM;

    if (getaddrinfo(host.constData(), NULL, &hints, &res) != 0) {
        // bad
        socket->mSignalError(socket, SocketClient::DnsError);
        socket->close();
        return;
    }

    for (p = res; p; p = p->ai_next) {
        if (p->ai_family == AF_INET) {
            addr = p->ai_addr;
            reinterpret_cast<sockaddr_in*>(addr)->sin_port = htons(port);
            size = sizeof(sockaddr_in);
            break;
        } else if (p->ai_family == AF_INET6) {
            addr = p->ai_addr;
            reinterpret_cast<sockaddr_in6*>(addr)->sin6_port = htons(port);
            size = sizeof(sockaddr_in6);
            break;
        }
    }

    if (!addr) {
        socket->mSignalError(socket, SocketClient::DnsError);
        socket->close();
        freeaddrinfo(res);
        res = 0;
        return;
    }
}